

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::GradientFillRectDecal
          (PixelGameEngine *this,vf2d *pos,vf2d *size,Pixel colTL,Pixel colBL,Pixel colBR,
          Pixel colTR)

{
  pointer pos_00;
  pointer uv;
  pointer col;
  anon_union_4_2_12391da5_for_Pixel_0 local_80;
  anon_union_4_2_12391da5_for_Pixel_0 local_7c;
  array<olc::Pixel,_4UL> cols;
  array<olc::v2d_generic<float>,_4UL> uvs;
  array<olc::v2d_generic<float>,_4UL> points;
  vf2d *size_local;
  vf2d *pos_local;
  PixelGameEngine *this_local;
  Pixel colTR_local;
  Pixel colBR_local;
  Pixel colBL_local;
  Pixel colTL_local;
  
  v2d_generic<float>::v2d_generic(uvs._M_elems + 3,pos);
  v2d_generic<float>::v2d_generic(points._M_elems,pos->x,pos->y + size->y);
  v2d_generic<float>::operator+(points._M_elems + 1,pos);
  v2d_generic<float>::v2d_generic(points._M_elems + 2,pos->x + size->x,pos->y);
  v2d_generic<float>::v2d_generic((v2d_generic<float> *)(cols._M_elems + 2),0.0,0.0);
  v2d_generic<float>::v2d_generic(uvs._M_elems,0.0,0.0);
  v2d_generic<float>::v2d_generic(uvs._M_elems + 1,0.0,0.0);
  v2d_generic<float>::v2d_generic(uvs._M_elems + 2,0.0,0.0);
  cols._M_elems[1] = colTR;
  local_80 = colTL.field_0;
  local_7c = colBL.field_0;
  cols._M_elems[0].field_0 = (anon_union_4_2_12391da5_for_Pixel_0)colBR;
  pos_00 = std::array<olc::v2d_generic<float>,_4UL>::data
                     ((array<olc::v2d_generic<float>,_4UL> *)(uvs._M_elems + 3));
  uv = std::array<olc::v2d_generic<float>,_4UL>::data
                 ((array<olc::v2d_generic<float>,_4UL> *)(cols._M_elems + 2));
  col = std::array<olc::Pixel,_4UL>::data((array<olc::Pixel,_4UL> *)&local_80.field_1);
  DrawExplicitDecal(this,(Decal *)0x0,pos_00,uv,col);
  return;
}

Assistant:

void PixelGameEngine::GradientFillRectDecal(const olc::vf2d& pos, const olc::vf2d& size, const olc::Pixel colTL, const olc::Pixel colBL, const olc::Pixel colBR, const olc::Pixel colTR)
	{
		std::array<olc::vf2d, 4> points = { { {pos}, {pos.x, pos.y + size.y}, {pos + size}, {pos.x + size.x, pos.y} } };
		std::array<olc::vf2d, 4> uvs = { {{0,0},{0,0},{0,0},{0,0}} };
		std::array<olc::Pixel, 4> cols = { {colTL, colBL, colBR, colTR} };
		DrawExplicitDecal(nullptr, points.data(), uvs.data(), cols.data());
	}